

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jama_lu.h
# Opt level: O3

Array2D<double> * __thiscall
JAMA::LU<double>::solve(Array2D<double> *__return_storage_ptr__,LU<double> *this,Array2D<double> *B)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  double **ppdVar4;
  double **ppdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double **ppdVar9;
  double **ppdVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  
  if (B->m_ == this->m) {
    uVar12 = (ulong)this->n;
    if ((long)uVar12 < 1) {
LAB_0016a64a:
      uVar2 = B->n_;
      uVar18 = (ulong)uVar2;
      permute_copy(__return_storage_ptr__,this,B,&this->piv,0,uVar2 - 1);
      iVar3 = this->n;
      uVar12 = (ulong)iVar3;
      if ((long)uVar12 < 1) {
        return __return_storage_ptr__;
      }
      uVar13 = 1;
      uVar15 = 0;
      do {
        uVar14 = uVar15 + 1;
        if (uVar14 < uVar12) {
          ppdVar4 = (__return_storage_ptr__->v_).data_;
          ppdVar5 = (this->LU_).v_.data_;
          uVar16 = uVar13;
          do {
            if (0 < (int)uVar2) {
              pdVar6 = ppdVar4[uVar15];
              pdVar7 = ppdVar5[uVar16];
              pdVar8 = ppdVar4[uVar16];
              uVar17 = 0;
              do {
                pdVar8[uVar17] = pdVar8[uVar17] - pdVar6[uVar17] * pdVar7[uVar15];
                uVar17 = uVar17 + 1;
              } while (uVar18 != uVar17);
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar12);
        }
        uVar13 = uVar13 + 1;
        uVar15 = uVar14;
      } while (uVar14 != uVar12);
      if (iVar3 < 1) {
        return __return_storage_ptr__;
      }
      ppdVar4 = (this->LU_).v_.data_;
      ppdVar5 = (__return_storage_ptr__->v_).data_;
      uVar15 = (ulong)(iVar3 - 1);
      do {
        uVar13 = uVar12 - 1;
        if (0 < (int)uVar2) {
          pdVar6 = ppdVar4[uVar13];
          pdVar7 = ppdVar5[uVar13];
          uVar14 = 0;
          do {
            pdVar7[uVar14] = pdVar7[uVar14] / pdVar6[uVar13];
            uVar14 = uVar14 + 1;
          } while (uVar18 != uVar14);
        }
        if ((long)uVar12 < 2) {
          return __return_storage_ptr__;
        }
        ppdVar9 = (__return_storage_ptr__->v_).data_;
        ppdVar10 = (this->LU_).v_.data_;
        uVar14 = 0;
        do {
          if (0 < (int)uVar2) {
            pdVar6 = ppdVar9[uVar13];
            pdVar7 = ppdVar10[uVar14];
            pdVar8 = ppdVar9[uVar14];
            uVar16 = 0;
            do {
              pdVar8[uVar16] = pdVar8[uVar16] - pdVar6[uVar16] * pdVar7[uVar13];
              uVar16 = uVar16 + 1;
            } while (uVar18 != uVar16);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar15);
        uVar15 = uVar15 - 1;
        bVar11 = 1 < (long)uVar12;
        uVar12 = uVar13;
      } while (bVar11);
      return __return_storage_ptr__;
    }
    ppdVar4 = (this->LU_).v_.data_;
    dVar1 = **ppdVar4;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      uVar18 = 1;
      do {
        uVar15 = uVar18;
        if (uVar12 == uVar15) break;
        dVar1 = ppdVar4[uVar15][uVar15];
        uVar18 = uVar15 + 1;
      } while ((dVar1 != 0.0) || (NAN(dVar1)));
      if (uVar12 <= uVar15) goto LAB_0016a64a;
    }
  }
  TNT::Array2D<double>::Array2D(__return_storage_ptr__,0,0);
  return __return_storage_ptr__;
}

Assistant:

Array2D<Real> solve (const Array2D<Real> &B) 
   {

	  /* Dimensions: A is mxn, X is nxk, B is mxk */
      
      if (B.dim1() != m) {
	  	return Array2D<Real>(0,0);
      }
      if (!isNonsingular()) {
        return Array2D<Real>(0,0);
      }

      // Copy right hand side with pivoting
      int nx = B.dim2();


	  Array2D<Real> X = permute_copy(B, piv, 0, nx-1);

      // Solve L*Y = B(piv,:)
      for (int k = 0; k < n; k++) {
         for (int i = k+1; i < n; i++) {
            for (int j = 0; j < nx; j++) {
               X[i][j] -= X[k][j]*LU_[i][k];
            }
         }
      }
      // Solve U*X = Y;
      for (int k = n-1; k >= 0; k--) {
         for (int j = 0; j < nx; j++) {
            X[k][j] /= LU_[k][k];
         }
         for (int i = 0; i < k; i++) {
            for (int j = 0; j < nx; j++) {
               X[i][j] -= X[k][j]*LU_[i][k];
            }
         }
      }
      return X;
   }